

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

int StringHold(Situation *s)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  UINT8 *pUVar13;
  uint uVar14;
  long lVar16;
  uint to;
  ulong uVar17;
  int local_9c;
  int string_value [2];
  ulong uVar12;
  ulong uVar15;
  
  pUVar13 = s->current_pieces + 0x27;
  lVar6 = 0;
  do {
    if (lVar6 == 2) {
      iVar9 = -(string_value[0] - string_value[1]);
      if (s->current_player == 0) {
        iVar9 = string_value[0] - string_value[1];
      }
      return iVar9;
    }
    string_value[lVar6] = 0;
    lVar3 = lVar6 * -0x10;
    uVar10 = (int)lVar3 + 0x20;
    uVar7 = lVar6 * 0x10 + 0x10;
    iVar9 = 1 - (int)lVar6;
    local_9c = 0;
    for (uVar8 = 7; uVar8 != 9; uVar8 = uVar8 + 1) {
      bVar1 = s->current_pieces[uVar8 | uVar7];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar3 + 0x124);
        uVar11 = bVar1 & 0xf;
        uVar12 = (ulong)uVar11;
        uVar14 = (uint)(bVar1 >> 4);
        uVar15 = (ulong)uVar14;
        if (bVar2 != 0) {
          uVar5 = bVar2 & 0xf;
          if (uVar11 == uVar5) {
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[uVar15 - 3][s->bit_col[uVar12]].cannon_capture
                [bVar2 <= bVar1]) {
              uVar17 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[uVar15 - 3][s->bit_col[uVar12]].
                                     rook_capture[bVar2 <= bVar1] << 4 | uVar11);
LAB_0010c498:
              if (((uVar10 & s->current_board[uVar17]) != 0) &&
                 ((0x66006600000U >> ((ulong)s->current_board[uVar17] & 0x3f) & 1) != 0)) {
                bVar4 = IfProtected(iVar9,(int)uVar17,s,(uint)bVar2);
                if (!bVar4) {
                  local_9c = local_9c + ""[(int)((bVar2 | 0x100) - (int)uVar17)];
                  string_value[lVar6] = local_9c;
                }
              }
            }
          }
          else if (uVar14 == bVar2 >> 4) {
            if (uVar5 == ROOK_CANNON_CAN_GET_ROW[uVar12 - 3][s->bit_col[uVar15]].cannon_capture
                         [bVar2 <= bVar1]) {
              uVar17 = (ulong)ROOK_CANNON_CAN_GET_ROW[uVar12 - 3][s->bit_col[uVar15]].rook_capture
                              [bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              goto LAB_0010c498;
            }
          }
        }
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          bVar2 = pUVar13[lVar16];
          uVar5 = (uint)bVar2;
          if (bVar2 != 0) {
            if (uVar11 == (uVar5 & 0xf)) {
              if (bVar2 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[(int)(uVar14 - 3)][s->bit_col[uVar12]].cannon_capture
                  [bVar2 <= bVar1]) {
                to = (uint)ROOK_CANNON_CAN_GET_COL[(int)(uVar14 - 3)][s->bit_col[uVar12]].
                           rook_capture[bVar2 <= bVar1] << 4 | uVar11;
                uVar17 = (ulong)to;
                if ((((uVar10 & s->current_board[uVar17]) != 0) &&
                    ((0x66006600000U >> ((ulong)s->current_board[uVar17] & 0x3f) & 1) != 0)) &&
                   (bVar4 = IfProtected(iVar9,uVar5,s,0), !bVar4)) {
                  bVar4 = IfProtected(iVar9,to,s,uVar5);
joined_r0x0010c681:
                  if (!bVar4) {
                    local_9c = local_9c + ""[(int)((uVar5 | 0x100) - (int)uVar17)];
                    string_value[lVar6] = local_9c;
                  }
                }
              }
            }
            else if (uVar14 == bVar2 >> 4) {
              if ((uVar5 & 0xf) ==
                  (uint)ROOK_CANNON_CAN_GET_ROW[(int)(uVar11 - 3)][s->bit_col[uVar15]].
                        cannon_capture[bVar2 <= bVar1]) {
                uVar17 = (ulong)ROOK_CANNON_CAN_GET_ROW[(int)(uVar11 - 3)][s->bit_col[uVar15]].
                                rook_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                if ((((uVar10 & s->current_board[uVar17]) != 0) &&
                    ((0x66006600000U >> ((ulong)s->current_board[uVar17] & 0x3f) & 1) != 0)) &&
                   (bVar4 = IfProtected(iVar9,(uint)bVar2,s,0), !bVar4)) {
                  bVar4 = IfProtected(iVar9,(int)uVar17,s,(uint)bVar2);
                  goto joined_r0x0010c681;
                }
              }
            }
          }
        }
      }
    }
    for (uVar8 = 9; uVar8 != 0xb; uVar8 = uVar8 + 1) {
      bVar1 = s->current_pieces[uVar8 | uVar7];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar3 + 0x124);
        uVar14 = bVar1 & 0xf;
        uVar15 = (ulong)uVar14;
        uVar11 = (uint)(bVar1 >> 4);
        uVar12 = (ulong)uVar11;
        if (bVar2 != 0) {
          uVar5 = bVar2 & 0xf;
          if (uVar14 == uVar5) {
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[uVar12 - 3][s->bit_col[uVar15]].supercannon_capture
                [bVar2 <= bVar1]) {
              uVar17 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[uVar12 - 3][s->bit_col[uVar15]].
                                     cannon_capture[bVar2 <= bVar1] << 4 | uVar14);
LAB_0010c806:
              if (((uVar10 & s->current_board[uVar17]) != 0) &&
                 ((0x66006600000U >> ((ulong)s->current_board[uVar17] & 0x3f) & 1) != 0)) {
                bVar4 = IfProtected(iVar9,(int)uVar17,s,(uint)bVar2);
                if (!bVar4) {
                  local_9c = local_9c + ""[(int)((bVar2 | 0x100) - (int)uVar17)];
                  string_value[lVar6] = local_9c;
                }
              }
            }
          }
          else if (uVar11 == bVar2 >> 4) {
            if (uVar5 == ROOK_CANNON_CAN_GET_ROW[uVar15 - 3][s->bit_col[uVar12]].supercannon_capture
                         [bVar2 <= bVar1]) {
              uVar17 = (ulong)ROOK_CANNON_CAN_GET_ROW[uVar15 - 3][s->bit_col[uVar12]].cannon_capture
                              [bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              goto LAB_0010c806;
            }
          }
        }
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          bVar2 = pUVar13[lVar16];
          if (bVar2 != 0) {
            uVar5 = bVar2 & 0xf;
            if (uVar14 == uVar5) {
              if (bVar2 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[(int)(uVar11 - 3)][s->bit_col[uVar15]].supercannon_capture
                  [bVar2 <= bVar1]) {
                uVar17 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[(int)(uVar11 - 3)]
                                       [s->bit_col[uVar15]].cannon_capture[bVar2 <= bVar1] << 4 |
                                uVar14);
LAB_0010c952:
                if (((uVar10 & s->current_board[uVar17]) != 0) &&
                   ((0x66006600000U >> ((ulong)s->current_board[uVar17] & 0x3f) & 1) != 0)) {
                  bVar4 = IfProtected(iVar9,(int)uVar17,s,(uint)bVar2);
                  if (!bVar4) {
                    local_9c = local_9c + ""[(int)((bVar2 | 0x100) - (int)uVar17)];
                    string_value[lVar6] = local_9c;
                  }
                }
              }
            }
            else if (uVar11 == bVar2 >> 4) {
              if (uVar5 == ROOK_CANNON_CAN_GET_ROW[(int)(uVar14 - 3)][s->bit_col[uVar12]].
                           supercannon_capture[bVar2 <= bVar1]) {
                uVar17 = (ulong)ROOK_CANNON_CAN_GET_ROW[(int)(uVar14 - 3)][s->bit_col[uVar12]].
                                cannon_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                goto LAB_0010c952;
              }
            }
          }
        }
      }
    }
    lVar6 = lVar6 + 1;
    pUVar13 = pUVar13 + -0x10;
  } while( true );
}

Assistant:

int StringHold(Situation &s)
{
    int dir, pos_from, pos_to, pos_str;
    int x, y, side_tag, opp_side_tag;
    int string_value[2];

    for (int r = 0; r < 2; r++)
    {
        string_value[r] = 0;
        side_tag = 16 + (r << 4);
        opp_side_tag = 32 - (r << 4);
        //考察用車牵制的情况
        for (int i = 7; i <= 8; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to)) //纵向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        // 如果车用炮的吃法(炮用超级炮的着法)能吃到目标子"sqDst"，牵制就成立了，下同
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4); //计算被牵制的子位置，是车(炮)本身能吃到的棋子
                            if (s.current_board[pos_str] & opp_side_tag)                                         //被牵制子必须是对方的子
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to)) // 如果被牵制子是有价值的，而且被牵制子没有保护(被目标子保护不算)，那么牵制是有价值的
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to)) //横向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }

        // 考查用炮来牵制的情况
        for (int i = 9; i <= 10; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return SideValue(s.current_player, string_value[RED] - string_value[BLACK]);
}